

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

ArraySubscript * new_array_subscript(void *name,void *expr)

{
  Token *pTVar1;
  void *pvVar2;
  ArraySubscript *pAVar3;
  undefined8 *puVar4;
  
  pvVar2 = malloc(0x20);
  pAVar3 = (ArraySubscript *)require_not_null(pvVar2,"Failed to allocate space");
  pvVar2 = malloc(0x10);
  puVar4 = (undefined8 *)require_not_null(pvVar2,"Failed to allocate space");
  puVar4[1] = 0;
  *puVar4 = subscript_eval;
  pTVar1 = (Token *)puVar4[1];
  (pAVar3->node).eval = (eval_handler_)*puVar4;
  (pAVar3->node).token = pTVar1;
  pAVar3->name = name;
  pAVar3->expr = expr;
  return pAVar3;
}

Assistant:

ArraySubscript*  new_array_subscript(void* name, void* expr){
    ArraySubscript* term  = new(ArraySubscript);
    term->node = tree_node_(NULL, eval_handler(subscript_eval));
    term->name = name;
    term->expr = expr;
    return term;
}